

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_sub_32_er_pd(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint addr_in;
  ulong uVar4;
  
  uVar2 = m68ki_cpu.ir;
  addr_in = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] - 4;
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = addr_in;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar4 = (ulong)(uVar2 >> 7 & 0x1c);
  uVar3 = m68k_read_memory_32(addr_in & m68ki_cpu.address_mask);
  uVar1 = *(uint *)((long)m68ki_cpu.dar + uVar4);
  m68ki_cpu.not_z_flag = uVar1 - uVar3;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  m68ki_cpu.x_flag =
       ((m68ki_cpu.not_z_flag | uVar3) & ~uVar1 | m68ki_cpu.not_z_flag & uVar3) >> 0x17;
  m68ki_cpu.v_flag = ((uVar1 ^ m68ki_cpu.not_z_flag) & (uVar3 ^ uVar1)) >> 0x18;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  *(uint *)((long)m68ki_cpu.dar + uVar4) = m68ki_cpu.not_z_flag;
  return;
}

Assistant:

static void m68k_op_sub_32_er_pd(void)
{
	uint* r_dst = &DX;
	uint src = OPER_AY_PD_32();
	uint dst = *r_dst;
	uint res = dst - src;

	FLAG_N = NFLAG_32(res);
	FLAG_X = FLAG_C = CFLAG_SUB_32(src, dst, res);
	FLAG_V = VFLAG_SUB_32(src, dst, res);
	FLAG_Z = MASK_OUT_ABOVE_32(res);

	*r_dst = FLAG_Z;
}